

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O2

void blowfish_ssh2_sdctr(ssh_cipher *cipher,void *blk,int len)

{
  uint32_t uVar1;
  uint uVar2;
  uint xR;
  uint8_t *p;
  uint32_t xL;
  bool bVar3;
  uint32_t b [2];
  uint local_40;
  uint local_3c;
  ssh_cipher *local_38;
  
  if ((len & 7U) == 0) {
    xL = *(uint32_t *)&cipher[-1].vt;
    xR = *(uint *)((long)&cipher[-1].vt + 4);
    local_38 = cipher;
    for (; 0 < len; len = len + -8) {
      blowfish_encrypt(xL,xR,&local_40,(BlowfishContext *)(cipher + -0x20a));
      uVar1 = GET_32BIT_MSB_FIRST(blk);
      uVar2 = uVar1 ^ local_40;
      *(uint *)blk = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
      ;
      uVar1 = GET_32BIT_MSB_FIRST((uint *)((long)blk + 4));
      uVar2 = uVar1 ^ local_3c;
      *(uint *)((long)blk + 4) =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      bVar3 = 0xfffffffe < xR;
      xR = xR + 1;
      xL = xL + bVar3;
      blk = (void *)((long)blk + 8);
    }
    *(uint32_t *)&local_38[-1].vt = xL;
    *(uint *)((long)&local_38[-1].vt + 4) = xR;
    return;
  }
  __assert_fail("(len & 7) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blowfish.c"
                ,0x1b5,"void blowfish_msb_sdctr(unsigned char *, int, BlowfishContext *)");
}

Assistant:

static void blowfish_ssh2_sdctr(ssh_cipher *cipher, void *blk, int len)
{
    struct blowfish_ctx *ctx = container_of(cipher, struct blowfish_ctx, ciph);
    blowfish_msb_sdctr(blk, len, &ctx->context);
}